

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O1

double __thiscall TasGrid::RuleWavelet::eval_cubic<0>(RuleWavelet *this,int point,double x)

{
  double *pdVar1;
  pointer pdVar2;
  double dVar3;
  long lVar4;
  uint uVar5;
  pointer pvVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar14 = x;
  if (point < 5) {
    if (point == 4) {
      dVar14 = -x;
      point = 3;
    }
    else if (point == 2) {
      dVar14 = -x;
      point = 1;
    }
    pvVar6 = (this->data).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar10 = this->num_data_points;
    iVar7 = -1;
    if ((ABS(dVar14) <= 1.0) && (iVar7 = 0, 2 < iVar10)) {
      iVar11 = iVar10 + -1;
      iVar7 = 0;
      do {
        iVar13 = (iVar7 + iVar11) / 2;
        if (*(double *)
             (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + (long)iVar13 * 8) <= dVar14) {
          iVar7 = iVar13;
          iVar13 = iVar11;
        }
        iVar11 = iVar13;
      } while (1 < iVar11 - iVar7);
    }
    if (iVar7 == -1) {
      return 0.0;
    }
    lVar9 = (long)(((point - (point + 1 >> 0x1f)) + 1 >> 1) * iVar10) * 8 +
            *(long *)&pvVar6[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
LAB_001c3e64:
    if (0 < iVar7) {
      iVar11 = iVar10 + -3;
      if (iVar7 - iVar10 < -2) {
        iVar11 = iVar7;
      }
      lVar4 = (long)(iVar11 + -1);
      goto LAB_001c3f42;
    }
  }
  else {
    uVar5 = point - 1U;
    iVar10 = -4;
    do {
      iVar7 = iVar10;
      uVar5 = (int)uVar5 >> 1;
      iVar10 = iVar7 + 1;
    } while (1 < uVar5);
    iVar7 = iVar7 + 4;
    if (iVar7 == 2) {
      if (0xc < point) {
        point = 0x19 - point;
        dVar14 = -x;
      }
      pvVar6 = (this->data).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar10 = this->num_data_points;
      iVar7 = -1;
      if ((ABS(x) <= 1.0) && (iVar7 = 0, 2 < iVar10)) {
        iVar11 = iVar10 + -1;
        iVar7 = 0;
        do {
          iVar13 = (iVar7 + iVar11) / 2;
          if (*(double *)
               (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + (long)iVar13 * 8) <= dVar14) {
            iVar7 = iVar13;
            iVar13 = iVar11;
          }
          iVar11 = iVar13;
        } while (1 < iVar11 - iVar7);
      }
      if (iVar7 == -1) {
        return 0.0;
      }
      lVar9 = (long)((point + -9) * iVar10) * 8 +
              *(long *)&pvVar6[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      goto LAB_001c3e64;
    }
    if (iVar7 == 1) {
      if (6 < point) {
        point = 0xd - point;
        dVar14 = -x;
      }
      pvVar6 = (this->data).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar10 = this->num_data_points;
      iVar7 = -1;
      if ((ABS(x) <= 1.0) && (iVar7 = 0, 2 < iVar10)) {
        iVar11 = iVar10 + -1;
        iVar7 = 0;
        do {
          iVar13 = (iVar7 + iVar11) / 2;
          if (*(double *)
               (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + (long)iVar13 * 8) <= dVar14) {
            iVar7 = iVar13;
            iVar13 = iVar11;
          }
          iVar11 = iVar13;
        } while (1 < iVar11 - iVar7);
      }
      if (iVar7 == -1) {
        return 0.0;
      }
      lVar9 = (long)((point + -5) * iVar10) * 8 +
              *(long *)&pvVar6[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      goto LAB_001c3e64;
    }
    iVar11 = 2 << ((byte)iVar7 & 0x1f);
    uVar5 = (int)(point - 1U) % iVar11;
    dVar14 = ldexp(1.0,iVar10);
    if ((int)uVar5 < 5) {
      pvVar6 = (this->data).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar10 = this->num_data_points;
      dVar14 = dVar14 * (x + 1.0) + -1.0;
      iVar7 = -1;
      if ((ABS(dVar14) <= 1.0) && (iVar7 = 0, 2 < iVar10)) {
        iVar11 = iVar10 + -1;
        iVar7 = 0;
        do {
          iVar13 = (iVar7 + iVar11) / 2;
          if (*(double *)
               (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + (long)iVar13 * 8) <= dVar14) {
            iVar7 = iVar13;
            iVar13 = iVar11;
          }
          iVar11 = iVar13;
        } while (1 < iVar11 - iVar7);
      }
      if (iVar7 == -1) {
        return 0.0;
      }
      iVar11 = uVar5 * iVar10;
LAB_001c3e5c:
      lVar9 = (long)iVar11 * 8 +
              *(long *)&pvVar6[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      goto LAB_001c3e64;
    }
    if (-6 < (int)(uVar5 - iVar11)) {
      pvVar6 = (this->data).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar10 = this->num_data_points;
      dVar14 = dVar14 * (1.0 - x) + -1.0;
      iVar7 = -1;
      if ((ABS(dVar14) <= 1.0) && (iVar7 = 0, 2 < iVar10)) {
        iVar13 = iVar10 + -1;
        iVar7 = 0;
        do {
          iVar12 = (iVar7 + iVar13) / 2;
          if (*(double *)
               (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + (long)iVar12 * 8) <= dVar14) {
            iVar7 = iVar12;
            iVar12 = iVar13;
          }
          iVar13 = iVar12;
        } while (1 < iVar13 - iVar7);
      }
      if (iVar7 == -1) {
        return 0.0;
      }
      iVar11 = (iVar11 + ~uVar5) * iVar10;
      goto LAB_001c3e5c;
    }
    pvVar6 = (this->data).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar10 = this->num_data_points;
    dVar14 = dVar14 * (x + 1.0) + -1.0 + (double)(int)(uVar5 - 5) * -0.125;
    iVar7 = -1;
    if ((ABS(dVar14) <= 1.0) && (iVar7 = 0, 2 < iVar10)) {
      iVar11 = iVar10 + -1;
      iVar7 = 0;
      do {
        iVar13 = (iVar7 + iVar11) / 2;
        if (*(double *)
             (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + (long)iVar13 * 8) <= dVar14) {
          iVar7 = iVar13;
          iVar13 = iVar11;
        }
        iVar11 = iVar13;
      } while (1 < iVar11 - iVar7);
    }
    if (iVar7 == -1) {
      return 0.0;
    }
    lVar9 = (long)iVar10 * 0x28 +
            *(long *)&pvVar6[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    if (0 < iVar7) {
      iVar11 = iVar10 + -3;
      if (iVar7 - iVar10 < -2) {
        iVar11 = iVar7;
      }
      lVar4 = (long)(iVar11 + -1);
      goto LAB_001c3f42;
    }
  }
  lVar4 = 0;
LAB_001c3f42:
  pdVar8 = (double *)
           (lVar4 * 8 +
           *(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data);
  pdVar1 = (double *)(lVar9 + lVar4 * 8);
  dVar3 = dVar14 - *pdVar8;
  dVar15 = dVar14 - pdVar8[1];
  dVar16 = dVar14 - pdVar8[2];
  dVar14 = dVar14 - pdVar8[3];
  pdVar2 = (this->cachexs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  return pdVar2[lVar4 * 4 + 3] * pdVar1[3] * dVar3 * dVar15 * dVar16 +
         pdVar2[lVar4 * 4 + 2] * pdVar1[2] * dVar3 * dVar15 * dVar14 +
         pdVar2[lVar4 * 4] * *pdVar1 * dVar15 * dVar16 * dVar14 +
         pdVar2[lVar4 * 4 + 1] * pdVar1[1] * dVar3 * dVar16 * dVar14;
}

Assistant:

inline double RuleWavelet::eval_cubic(int point, double x) const{
    // Helps stabilize numerical errors.
    if (point == 0 and x == 0.0 and mode == 1) return 0.0;

    // Evaluates a third order wavelet at a given point x.
    double sgn = 1.0;
    if (point < 5){ // Scaling functions
        if (point == 2){ // Reflect across y-axis
            point = 1;
            sgn = -1.0;
            x = -x;
        }else if(point == 4){
            point = 3;
            sgn = -1.0;
            x = -x;
        }
        const double *phi = &(data[1][((point+1)/2) * num_data_points]);
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    int l = Maths::intlog2(point - 1);

    if(l == 2){
        if (point > 6){
            // i.e. 7 or 8
            // These wavelets are reflections across the y-axis of 6 & 5, respectively
            x = -x;
            sgn = -1.0;
            point = 13 - point;
        }
        point -= 5;
        const double *phi = &data[2][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }else if(l == 3){
        if (point > 12){
            // i.e. 13, 14, 15, 16
            // These wavelets are reflections of 12, 11, 10, 9, respectively
            x = -x;
            sgn = -1.0;
            point = 25 - point;
        }
        point -= 9;
        const double *phi = &data[3][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    // Standard lifted wavelets.
    int subindex = (point - 1) % (1 << l);
    double scale = pow(2,l-4);
    double value;
    if (subindex < 5){
        // Left boundary wavelet.
        value = interpolate<mode>(&data[4][subindex*num_data_points], scale * (x + 1.) - 1.);
    } else if ((1 << l) - 1 - subindex < 5){
        // Right boundary wavelet.
        value = interpolate<mode>(&data[4][((1 << l) - subindex - 1)*num_data_points], scale * (1. - x) - 1.);
    } else {
        // Central wavelets.
        double shift = 0.125 * (double (subindex - 5));
        value = interpolate<mode>(&data[4][5*num_data_points], scale * (x + 1.) -1. - shift);
    }
    // Adjust for the chain rule multiplier.
    if (mode == 1) value *= ((1 << l) - 1 - subindex < 5) ? -scale : scale;

    return value;
}